

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::forDynamicArray
          (Compilation *comp,ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Type *elementType,SourceRange sourceRange)

{
  bool bVar1;
  Expression *this;
  Compilation *in_RCX;
  ExpressionSyntax *in_R8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  Expression *in_stack_00000008;
  Compilation *in_stack_00000010;
  ReplicatedAssignmentPatternExpression *result;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  bool bad;
  Expression *countExpr;
  size_t count;
  ASTContext *in_stack_000000e8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_000000f0;
  bitwidth_t in_stack_000000fc;
  size_t in_stack_00000100;
  Type *in_stack_00000108;
  Type *in_stack_00000110;
  undefined1 in_stack_00000130 [16];
  bool *in_stack_00000140;
  Expression *in_stack_ffffffffffffff68;
  Compilation *in_stack_ffffffffffffff70;
  Compilation *args_3;
  undefined7 in_stack_ffffffffffffffb8;
  byte bVar3;
  size_t *in_stack_ffffffffffffffc0;
  ASTContext *context_00;
  ReplicatedAssignmentPatternExpression *local_8;
  
  context_00 = (ASTContext *)0x0;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x961d6a);
  this = bindReplCount(in_RCX,in_R8,context_00,in_stack_ffffffffffffffc0);
  bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff70);
  if (bVar1) {
    local_8 = (ReplicatedAssignmentPatternExpression *)
              Expression::badExpr(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    bVar3 = 0;
    args_3 = in_stack_00000010;
    sVar2 = bindExpressionList(in_stack_00000110,in_stack_00000108,in_stack_00000100,
                               in_stack_000000fc,in_stack_000000f0,in_stack_000000e8,
                               (SourceRange)in_stack_00000130,in_stack_00000140);
    local_8 = BumpAllocator::
              emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                        ((BumpAllocator *)this,(Type *)CONCAT17(bVar3,in_stack_ffffffffffffffb8),
                         (Expression *)sVar2._M_extent._M_extent_value._M_extent_value,
                         (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         sVar2._M_ptr,(SourceRange *)args_3);
    if ((bVar3 & 1) != 0) {
      local_8 = (ReplicatedAssignmentPatternExpression *)
                Expression::badExpr(in_stack_00000010,in_stack_00000008);
    }
  }
  return (Expression *)local_8;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forDynamicArray(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, count, 0, syntax.items, context, sourceRange,
                                    bad);

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr, elems,
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}